

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

int strpool_decref(strpool_t *pool,unsigned_long_long handle)

{
  strpool_internal_entry_t *psVar1;
  strpool_internal_entry_t *entry;
  unsigned_long_long handle_local;
  strpool_t *pool_local;
  
  psVar1 = strpool_internal_get_entry(pool,handle);
  if (psVar1 == (strpool_internal_entry_t *)0x0) {
    pool_local._4_4_ = 0;
  }
  else {
    if (psVar1->refcount < 1) {
      __assert_fail("( entry->refcount > 0 ) && ( \"Invalid ref count\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/strpool.h"
                    ,0x494,"int strpool_decref(strpool_t *, unsigned long long)");
    }
    psVar1->refcount = psVar1->refcount + -1;
    pool_local._4_4_ = psVar1->refcount;
  }
  return pool_local._4_4_;
}

Assistant:

int strpool_decref( strpool_t* pool, STRPOOL_U64 handle )
    {
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry )
        {
        STRPOOL_ASSERT( entry->refcount > 0, "Invalid ref count" );
        --entry->refcount;
        return entry->refcount;
        }
    return 0;
    }